

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xatlas.cpp
# Opt level: O2

void __thiscall xatlas::internal::UniformGrid2::~UniformGrid2(UniformGrid2 *this)

{
  ArrayBase::~ArrayBase(&(this->m_traversedCellOffsets).m_base);
  ArrayBase::~ArrayBase(&(this->m_potentialEdges).m_base);
  ArrayBase::~ArrayBase(&(this->m_cellData).m_base);
  ArrayBase::~ArrayBase(&(this->m_cellDataOffsets).m_base);
  ArrayBase::~ArrayBase((ArrayBase *)this);
  return;
}

Assistant:

void reset(const Vector2 *positions, const uint32_t *indices = nullptr, uint32_t reserveEdgeCount = 0)
	{
		m_edges.clear();
		if (reserveEdgeCount > 0)
			m_edges.reserve(reserveEdgeCount);
		m_positions = positions;
		m_indices = indices;
		m_cellDataOffsets.clear();
	}